

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::sdivrem(APInt *LHS,int64_t RHS,APInt *Quotient,int64_t *Remainder)

{
  bool bVar1;
  uint64_t R;
  uint64_t local_60;
  APInt local_58;
  APInt local_48;
  APInt local_38;
  
  local_60 = *Remainder;
  bVar1 = isNegative(LHS);
  if (bVar1) {
    if (RHS < 0) {
      APInt(&local_38,LHS);
      operator-((llvm *)&local_58,&local_38);
      udivrem(&local_58,-RHS,Quotient,&local_60);
      ~APInt(&local_58);
      ~APInt(&local_38);
    }
    else {
      APInt(&local_48,LHS);
      operator-((llvm *)&local_58,&local_48);
      udivrem(&local_58,RHS,Quotient,&local_60);
      ~APInt(&local_58);
      ~APInt(&local_48);
      negate(Quotient);
    }
    local_60 = -local_60;
  }
  else if (RHS < 0) {
    udivrem(LHS,-RHS,Quotient,&local_60);
    negate(Quotient);
  }
  else {
    udivrem(LHS,RHS,Quotient,&local_60);
  }
  *Remainder = local_60;
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, int64_t RHS,
                    APInt &Quotient, int64_t &Remainder) {
  uint64_t R = Remainder;
  if (LHS.isNegative()) {
    if (RHS < 0)
      APInt::udivrem(-LHS, -RHS, Quotient, R);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, R);
      Quotient.negate();
    }
    R = -R;
  } else if (RHS < 0) {
    APInt::udivrem(LHS, -RHS, Quotient, R);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, R);
  }
  Remainder = R;
}